

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O2

StringRef __thiscall llvm::Twine::toStringRef(Twine *this,SmallVectorImpl<char> *Out)

{
  StringRef SVar1;
  
  if (((this->RHSKind == EmptyKind) && (this->LHSKind < 7)) &&
     ((0x7aU >> (this->LHSKind & 0x1f) & 1) != 0)) {
    SVar1 = getSingleStringRef(this);
  }
  else {
    toVector(this,Out);
    SVar1.Length._4_4_ = 0;
    SVar1._0_12_ = *(undefined1 (*) [12])
                    &(Out->super_SmallVectorTemplateBase<char,_true>).
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase;
  }
  return SVar1;
}

Assistant:

StringRef toStringRef(SmallVectorImpl<char> &Out) const {
      if (isSingleStringRef())
        return getSingleStringRef();
      toVector(Out);
      return StringRef(Out.data(), Out.size());
    }